

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetris.cpp
# Opt level: O0

void decide(int *blockForEnemy,int *finalX,int *finalY,int *finalO)

{
  int tmp;
  int *in_stack_000001f8;
  int *in_stack_00000200;
  int *in_stack_00000208;
  GameBoard *in_stack_00000210;
  int *in_stack_0001d2b8;
  int *in_stack_0001d2c0;
  int in_stack_0001d2c8;
  int in_stack_0001d2cc;
  GameBoard *in_stack_0001d2d0;
  int in_stack_0001d2dc;
  int *in_stack_0001d2f0;
  int *in_stack_0001d2f8;
  function<double_(Board,_const_Block_&,_double_&,_bool)> *in_stack_ffffffffffffffb0;
  undefined1 local_40 [64];
  
  std::function<double(Board,Block_const&,double&,bool)>::
  function<double(&)(Board,Block_const&,double&,bool),void>
            (in_stack_ffffffffffffffb0,(_func_double_Board_Block_ptr_double_ptr_bool *)local_40);
  set_Eval((function<double_(Board,_const_Block_&,_double_&,_bool)> *)0x1248a8);
  std::function<double_(Board,_const_Block_&,_double_&,_bool)>::~function
            ((function<double_(Board,_const_Block_&,_double_&,_bool)> *)0x1248b4);
  precalc(in_stack_00000210,in_stack_00000208,in_stack_00000200,in_stack_000001f8);
  Place_Turn(in_stack_0001d2dc,in_stack_0001d2d0,in_stack_0001d2cc,in_stack_0001d2c8,
             in_stack_0001d2c0,in_stack_0001d2b8,in_stack_0001d2f0,in_stack_0001d2f8);
  Place_Turn(in_stack_0001d2dc,in_stack_0001d2d0,in_stack_0001d2cc,in_stack_0001d2c8,
             in_stack_0001d2c0,in_stack_0001d2b8,in_stack_0001d2f0,in_stack_0001d2f8);
  return;
}

Assistant:

void decide(int &blockForEnemy, int &finalX, int &finalY, int &finalO)
{
    set_Eval(evaluate2_sweet);
    int tmp;
    precalc(gameBoard, myele, enemyele, enemyht);
    //printf("%d %d %d\n", myele, enemyele, enemyht);

    Place_Turn(1, gameBoard, gameBoard.currBotColor, gameBoard.currBlockType, finalX, finalY, finalO, tmp);
    //while(1);
    Place_Turn(1, gameBoard, gameBoard.currBotColor ^ 1, gameBoard.enemyType, tmp, tmp, tmp, blockForEnemy);
    //naive_place(gameBoard, gameBoard.currBotColor, gameBoard.currBlockType, evaluate3, finalX, finalY, finalO);
    //naive_jam(gameBoard, evaluate3, blockForEnemy);
}